

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpg4d_parser.c
# Opt level: O1

MPP_RET mpp_mpg4_parser_deinit(Mpg4dParser ctx)

{
  if (((byte)mpg4d_debug & 1) != 0) {
    _mpp_log_l(4,"mpg4d_parser","in\n","mpp_mpg4_parser_deinit");
  }
  if (ctx != (Mpg4dParser)0x0) {
    if (*(void **)((long)ctx + 0x38) != (void *)0x0) {
      mpp_osal_free("mpp_mpg4_parser_deinit",*(void **)((long)ctx + 0x38));
      *(undefined8 *)((long)ctx + 0x38) = 0;
    }
    if (*(void **)((long)ctx + 0x378) != (void *)0x0) {
      mpp_osal_free("mpp_mpg4_parser_deinit",*(void **)((long)ctx + 0x378));
      *(undefined8 *)((long)ctx + 0x378) = 0;
    }
    mpp_osal_free("mpp_mpg4_parser_deinit",ctx);
  }
  if (((byte)mpg4d_debug & 1) != 0) {
    _mpp_log_l(4,"mpg4d_parser","out\n","mpp_mpg4_parser_deinit");
  }
  return MPP_OK;
}

Assistant:

MPP_RET mpp_mpg4_parser_deinit(Mpg4dParser ctx)
{
    Mpg4dParserImpl *p = (Mpg4dParserImpl *)ctx;

    mpg4d_dbg_func("in\n");

    if (p) {
        if (p->bit_ctx) {
            mpp_free(p->bit_ctx);
            p->bit_ctx = NULL;
        }
        if (p->syntax) {
            mpp_free(p->syntax);
            p->syntax = NULL;
        }
        mpp_free(p);
    }

    mpg4d_dbg_func("out\n");

    return MPP_OK;
}